

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

exr_result_t
internal_exr_validate_shared_attrs
          (exr_context_t ctxt,exr_priv_part_t basepart,exr_priv_part_t curpart,int curpartidx,
          char **mismatchattr,int *mismatchcount)

{
  char *pcVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [12];
  undefined1 auVar7 [13];
  undefined1 auVar8 [14];
  exr_result_t eVar9;
  exr_result_t eVar10;
  long in_RDX;
  long in_RSI;
  exr_const_context_t_conflict in_R8;
  uint *in_R9;
  bool bVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  int misidx;
  exr_attribute_t *cattr;
  exr_attribute_t *battr;
  exr_result_t rv1;
  exr_result_t rv;
  uint local_4c;
  long local_48;
  exr_attribute_t **in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar26;
  
  if (*(long *)(in_RSI + 0x38) == 0) {
    bVar11 = *(long *)(in_RDX + 0x38) != 0;
  }
  else if (*(long *)(in_RDX + 0x38) == 0) {
    bVar11 = true;
  }
  else if ((*(int *)(*(long *)(in_RSI + 0x38) + 0x14) == 1) &&
          (*(int *)(*(long *)(in_RSI + 0x38) + 0x14) == *(int *)(*(long *)(in_RDX + 0x38) + 0x14)))
  {
    pcVar1 = *(char **)(*(long *)(in_RSI + 0x38) + 0x18);
    pcVar2 = *(char **)(*(long *)(in_RDX + 0x38) + 0x18);
    cVar12 = -(pcVar1[2] == pcVar2[2]);
    cVar13 = -(pcVar1[3] == pcVar2[3]);
    cVar14 = -(pcVar1[4] == pcVar2[4]);
    cVar15 = -(pcVar1[5] == pcVar2[5]);
    cVar16 = -(pcVar1[6] == pcVar2[6]);
    cVar17 = -(pcVar1[7] == pcVar2[7]);
    cVar18 = -(pcVar1[8] == pcVar2[8]);
    cVar19 = -(pcVar1[9] == pcVar2[9]);
    cVar20 = -(pcVar1[10] == pcVar2[10]);
    cVar21 = -(pcVar1[0xb] == pcVar2[0xb]);
    cVar22 = -(pcVar1[0xc] == pcVar2[0xc]);
    cVar23 = -(pcVar1[0xd] == pcVar2[0xd]);
    cVar24 = -(pcVar1[0xe] == pcVar2[0xe]);
    bVar25 = -(pcVar1[0xf] == pcVar2[0xf]);
    auVar3[1] = -(pcVar1[1] == pcVar2[1]);
    auVar3[0] = -(*pcVar1 == *pcVar2);
    auVar3[2] = cVar12;
    auVar3[3] = cVar13;
    auVar3[4] = cVar14;
    auVar3[5] = cVar15;
    auVar3[6] = cVar16;
    auVar3[7] = cVar17;
    auVar3[8] = cVar18;
    auVar3[9] = cVar19;
    auVar3[10] = cVar20;
    auVar3[0xb] = cVar21;
    auVar3[0xc] = cVar22;
    auVar3[0xd] = cVar23;
    auVar3[0xe] = cVar24;
    auVar3[0xf] = bVar25;
    auVar4[1] = -(pcVar1[1] == pcVar2[1]);
    auVar4[0] = -(*pcVar1 == *pcVar2);
    auVar4[2] = cVar12;
    auVar4[3] = cVar13;
    auVar4[4] = cVar14;
    auVar4[5] = cVar15;
    auVar4[6] = cVar16;
    auVar4[7] = cVar17;
    auVar4[8] = cVar18;
    auVar4[9] = cVar19;
    auVar4[10] = cVar20;
    auVar4[0xb] = cVar21;
    auVar4[0xc] = cVar22;
    auVar4[0xd] = cVar23;
    auVar4[0xe] = cVar24;
    auVar4[0xf] = bVar25;
    auVar8[1] = cVar13;
    auVar8[0] = cVar12;
    auVar8[2] = cVar14;
    auVar8[3] = cVar15;
    auVar8[4] = cVar16;
    auVar8[5] = cVar17;
    auVar8[6] = cVar18;
    auVar8[7] = cVar19;
    auVar8[8] = cVar20;
    auVar8[9] = cVar21;
    auVar8[10] = cVar22;
    auVar8[0xb] = cVar23;
    auVar8[0xc] = cVar24;
    auVar8[0xd] = bVar25;
    auVar7[1] = cVar14;
    auVar7[0] = cVar13;
    auVar7[2] = cVar15;
    auVar7[3] = cVar16;
    auVar7[4] = cVar17;
    auVar7[5] = cVar18;
    auVar7[6] = cVar19;
    auVar7[7] = cVar20;
    auVar7[8] = cVar21;
    auVar7[9] = cVar22;
    auVar7[10] = cVar23;
    auVar7[0xb] = cVar24;
    auVar7[0xc] = bVar25;
    auVar6[1] = cVar15;
    auVar6[0] = cVar14;
    auVar6[2] = cVar16;
    auVar6[3] = cVar17;
    auVar6[4] = cVar18;
    auVar6[5] = cVar19;
    auVar6[6] = cVar20;
    auVar6[7] = cVar21;
    auVar6[8] = cVar22;
    auVar6[9] = cVar23;
    auVar6[10] = cVar24;
    auVar6[0xb] = bVar25;
    auVar5[1] = cVar16;
    auVar5[0] = cVar15;
    auVar5[2] = cVar17;
    auVar5[3] = cVar18;
    auVar5[4] = cVar19;
    auVar5[5] = cVar20;
    auVar5[6] = cVar21;
    auVar5[7] = cVar22;
    auVar5[8] = cVar23;
    auVar5[9] = cVar24;
    auVar5[10] = bVar25;
    bVar11 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar8 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar7 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar6 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(
                                                  cVar22,CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(
                                                  cVar19,CONCAT12(cVar18,CONCAT11(cVar17,cVar16)))))
                                                  )))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(
                                                  cVar22,CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(
                                                  cVar19,CONCAT11(cVar18,cVar17)))))))) >> 7) & 1)
                      << 7 | (ushort)(bVar25 >> 7) << 0xf) != 0xffff;
  }
  else {
    bVar11 = true;
  }
  if (bVar11) {
    *(char **)in_R8 = "displayWindow";
  }
  local_4c = (uint)bVar11;
  iVar26 = 0;
  if (*(long *)(in_RSI + 0x48) == 0) {
    if (*(long *)(in_RDX + 0x48) != 0) {
      iVar26 = 0x10;
    }
  }
  else if (*(long *)(in_RDX + 0x48) == 0) {
    iVar26 = 0x10;
  }
  else if ((*(int *)(*(long *)(in_RSI + 0x48) + 0x14) == 8) &&
          (*(int *)(*(long *)(in_RSI + 0x48) + 0x14) == *(int *)(*(long *)(in_RDX + 0x48) + 0x14)))
  {
    if (*(int *)(*(long *)(in_RSI + 0x48) + 0x18) != *(int *)(*(long *)(in_RDX + 0x48) + 0x18)) {
      iVar26 = 0x10;
    }
  }
  else {
    iVar26 = 0x10;
  }
  if (iVar26 != 0) {
    *(char **)(&in_R8->mode + (long)(int)local_4c * 8) = "pixelAspectRatio";
    local_4c = local_4c + 1;
  }
  eVar9 = exr_get_attribute_by_name
                    (in_R8,(int)((ulong)in_R9 >> 0x20),
                     (char *)CONCAT44(iVar26,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0);
  eVar10 = exr_get_attribute_by_name
                     (in_R8,(int)((ulong)in_R9 >> 0x20),
                      (char *)CONCAT44(eVar9,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0);
  if ((eVar9 == 0) && (eVar10 == 0)) {
    if ((*(int *)((long)in_stack_ffffffffffffffc0 + 0x14) == 0x16) &&
       (*(int *)((long)in_stack_ffffffffffffffc0 + 0x14) == *(int *)(local_48 + 0x14))) {
      if (in_stack_ffffffffffffffc0[3]->name == (char *)**(long **)(local_48 + 0x18)) {
        iVar26 = 0;
      }
      else {
        iVar26 = 0x10;
      }
    }
    else {
      iVar26 = 0x10;
    }
  }
  else if (eVar10 == 0) {
    iVar26 = 0x10;
  }
  else {
    iVar26 = 0;
  }
  if (iVar26 != 0) {
    *(char **)(&in_R8->mode + (long)(int)local_4c * 8) = "timecode";
    local_4c = local_4c + 1;
  }
  eVar9 = exr_get_attribute_by_name
                    (in_R8,(int)((ulong)in_R9 >> 0x20),(char *)CONCAT44(iVar26,eVar10),
                     in_stack_ffffffffffffffc0);
  eVar10 = exr_get_attribute_by_name
                     (in_R8,(int)((ulong)in_R9 >> 0x20),(char *)CONCAT44(eVar9,eVar10),
                      in_stack_ffffffffffffffc0);
  if ((eVar9 == 0) && (eVar10 == 0)) {
    if ((*(int *)((long)in_stack_ffffffffffffffc0 + 0x14) == 4) &&
       (*(int *)((long)in_stack_ffffffffffffffc0 + 0x14) == *(int *)(local_48 + 0x14))) {
      iVar26 = memcmp(in_stack_ffffffffffffffc0[3],*(void **)(local_48 + 0x18),0x20);
      bVar11 = iVar26 != 0;
    }
    else {
      bVar11 = true;
    }
  }
  else {
    bVar11 = eVar10 == 0;
  }
  if (bVar11) {
    *(char **)(&in_R8->mode + (long)(int)local_4c * 8) = "chromaticities";
    local_4c = local_4c + 1;
  }
  *in_R9 = local_4c;
  eVar9 = 0x10;
  if (local_4c == 0) {
    eVar9 = 0;
  }
  return eVar9;
}

Assistant:

exr_result_t
internal_exr_validate_shared_attrs (exr_context_t ctxt,
                                    exr_priv_part_t basepart,
                                    exr_priv_part_t curpart,
                                    int curpartidx,
                                    const char **mismatchattr,
                                    int *mismatchcount)
{
    exr_result_t rv, rv1;
    const exr_attribute_t *battr, *cattr;
    int misidx = 0;

    rv = EXR_ERR_SUCCESS;
    if (basepart->displayWindow)
    {
        if (curpart->displayWindow)
        {
            if (basepart->displayWindow->type != EXR_ATTR_BOX2I ||
                basepart->displayWindow->type !=
                curpart->displayWindow->type)
            {
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
            }
            else if (memcmp (basepart->displayWindow->box2i,
                             curpart->displayWindow->box2i,
                             sizeof(exr_attr_box2i_t)))
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    }
    else if (curpart->displayWindow)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;

    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = EXR_REQ_DISP_STR;

    rv = EXR_ERR_SUCCESS;
    if (basepart->pixelAspectRatio)
    {
        if (curpart->pixelAspectRatio)
        {
            if (basepart->pixelAspectRatio->type != EXR_ATTR_FLOAT ||
                basepart->pixelAspectRatio->type !=
                curpart->pixelAspectRatio->type)
            {
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
            }
            else if (memcmp (&(basepart->pixelAspectRatio->f),
                             &(curpart->pixelAspectRatio->f),
                             sizeof(float)))
                rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    }
    else if (curpart->pixelAspectRatio)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = EXR_REQ_PAR_STR;

    rv = exr_get_attribute_by_name (ctxt, 0, "timecode", &battr);
    rv1 = exr_get_attribute_by_name (ctxt, curpartidx, "timecode", &cattr);
    if (EXR_ERR_SUCCESS == rv && rv == rv1)
    {
        if (battr->type != EXR_ATTR_TIMECODE ||
            battr->type != cattr->type)
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else if (memcmp (battr->timecode,
                         cattr->timecode,
                         sizeof(exr_attr_timecode_t)))
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else
            rv = EXR_ERR_SUCCESS;
    }
    else if (EXR_ERR_SUCCESS == rv1)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    else
        rv = EXR_ERR_SUCCESS; // both missing, ok
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = "timecode";

    rv = exr_get_attribute_by_name (ctxt, 0, "chromaticities", &battr);
    rv1 = exr_get_attribute_by_name (ctxt, curpartidx, "chromaticities", &cattr);
    if (EXR_ERR_SUCCESS == rv && rv == rv1)
    {
        if (battr->type != EXR_ATTR_CHROMATICITIES ||
            battr->type != cattr->type)
        {
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        }
        else if (memcmp (battr->chromaticities,
                         cattr->chromaticities,
                         sizeof(exr_attr_chromaticities_t)))
            rv = EXR_ERR_ATTR_TYPE_MISMATCH;
        else
            rv = EXR_ERR_SUCCESS;
    }
    else if (EXR_ERR_SUCCESS == rv1)
        rv = EXR_ERR_ATTR_TYPE_MISMATCH;
    else
        rv = EXR_ERR_SUCCESS; // both missing, ok
    if (rv != EXR_ERR_SUCCESS)
        mismatchattr[misidx++] = "chromaticities";

    *mismatchcount = misidx;
    return misidx == 0 ? EXR_ERR_SUCCESS : EXR_ERR_ATTR_TYPE_MISMATCH;
}